

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniply.cpp
# Opt level: O3

void __thiscall miniply::PLYReader::next_element(PLYReader *this)

{
  pointer puVar1;
  pointer puVar2;
  long lVar3;
  byte bVar4;
  ushort uVar5;
  bool bVar6;
  double *pdVar7;
  uint uVar8;
  ulong uVar9;
  pointer pPVar10;
  char *pcVar11;
  ulong __n;
  pointer pPVar12;
  float fVar13;
  uint uVar14;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *__c;
  char *__src;
  pointer pPVar15;
  uint8_t tmp [8];
  double local_58;
  pointer local_50;
  char *local_48;
  uint local_3c;
  pointer local_38;
  
  if (this->m_valid == true) {
    uVar9 = this->m_currentElement;
    pPVar15 = (this->m_elements).
              super__Vector_base<miniply::PLYElement,_std::allocator<miniply::PLYElement>_>._M_impl.
              super__Vector_impl_data._M_start;
    if (uVar9 < (ulong)(((long)(this->m_elements).
                               super__Vector_base<miniply::PLYElement,_std::allocator<miniply::PLYElement>_>
                               ._M_impl.super__Vector_impl_data._M_finish - (long)pPVar15 >> 3) *
                       -0x71c71c71c71c71c7)) {
      pPVar15 = pPVar15 + uVar9;
      this->m_currentElement = uVar9 + 1;
      if (this->m_elementLoaded == true) {
        pPVar10 = (pPVar15->properties).
                  super__Vector_base<miniply::PLYProperty,_std::allocator<miniply::PLYProperty>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        pPVar12 = *(pointer *)
                   ((long)&(pPVar15->properties).
                           super__Vector_base<miniply::PLYProperty,_std::allocator<miniply::PLYProperty>_>
                           ._M_impl + 8);
        if (pPVar10 != pPVar12) {
          __c = &pPVar10->listData;
          do {
            if (*(int *)((long)(__c + -1) + 0xc) != 8) {
              puVar1 = (__c->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                       _M_impl.super__Vector_impl_data._M_start;
              if ((__c->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                  super__Vector_impl_data._M_finish != puVar1) {
                (__c->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                super__Vector_impl_data._M_finish = puVar1;
              }
              if ((__c->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                  super__Vector_impl_data._M_end_of_storage != puVar1) {
                std::
                __shrink_to_fit_aux<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_true>
                ::_S_do_it(__c);
              }
              puVar2 = (((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(__c + 1))->
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                       super__Vector_impl_data._M_start;
              if ((((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(__c + 1))->
                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                  super__Vector_impl_data._M_finish != puVar2) {
                (((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(__c + 1))->
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                super__Vector_impl_data._M_finish = puVar2;
              }
              if ((((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(__c + 1))->
                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                  super__Vector_impl_data._M_end_of_storage != puVar2) {
                std::
                __shrink_to_fit_aux<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_true>
                ::_S_do_it((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(__c + 1));
              }
            }
            pPVar10 = (pointer)(__c + 2);
            __c = __c + 4;
          } while (pPVar10 != pPVar12);
        }
        puVar1 = (this->m_elementData).
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start;
        if ((this->m_elementData).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_finish != puVar1) {
          (this->m_elementData).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_finish = puVar1;
        }
        this->m_elementLoaded = false;
      }
      else if (this->m_fileType == ASCII) {
        if (pPVar15->count != 0) {
          uVar14 = 0;
          do {
            next_line(this);
            uVar14 = uVar14 + 1;
          } while (uVar14 < pPVar15->count);
        }
      }
      else if (pPVar15->fixedSize == true) {
        pcVar11 = this->m_pos + ((ulong)(pPVar15->count * pPVar15->rowStride) - (long)this->m_buf);
        if (0x1ffff < (long)pcVar11) {
          lVar3 = this->m_bufOffset;
          this->m_bufOffset = (int64_t)(pcVar11 + lVar3);
          fseeko((FILE *)this->m_f,(__off_t)(pcVar11 + lVar3),0);
          pcVar11 = this->m_buf + 0x20000;
          this->m_bufEnd = pcVar11;
          this->m_pos = pcVar11;
          this->m_end = pcVar11;
          refill_buffer(this);
          return;
        }
        pcVar11 = this->m_buf + (long)pcVar11;
        this->m_pos = pcVar11;
        this->m_end = pcVar11;
      }
      else {
        uVar14 = pPVar15->count;
        local_50 = pPVar15;
        if (this->m_fileType == Binary) {
          if (uVar14 != 0) {
            uVar8 = 0;
            do {
              pPVar10 = (local_50->properties).
                        super__Vector_base<miniply::PLYProperty,_std::allocator<miniply::PLYProperty>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              pPVar12 = *(pointer *)
                         ((long)&(local_50->properties).
                                 super__Vector_base<miniply::PLYProperty,_std::allocator<miniply::PLYProperty>_>
                                 ._M_impl + 8);
              if (pPVar10 != pPVar12) {
                local_48 = (char *)CONCAT44(local_48._4_4_,uVar8);
                do {
                  uVar9 = (ulong)pPVar10->countType;
                  if (uVar9 == 8) {
                    uVar9 = (ulong)*(uint *)(kPLYPropertySize + (ulong)pPVar10->type * 4);
                    pdVar7 = (double *)this->m_pos;
                    if (this->m_bufEnd < (char *)((long)pdVar7 + uVar9)) goto LAB_00103869;
                    goto LAB_0010388b;
                  }
                  uVar14 = *(uint *)(kPLYPropertySize + uVar9 * 4);
                  pcVar11 = this->m_bufEnd;
                  pdVar7 = (double *)this->m_pos;
                  if (pcVar11 < (char *)((long)pdVar7 + (ulong)uVar14)) {
                    bVar6 = refill_buffer(this);
                    if (!bVar6) {
LAB_00103ab3:
                      this->m_valid = false;
                      return;
                    }
                    pcVar11 = this->m_bufEnd;
                    pdVar7 = (double *)this->m_pos;
                    if (pcVar11 < (char *)((long)pdVar7 + (ulong)uVar14)) goto LAB_00103ab3;
                    uVar9 = (ulong)pPVar10->countType;
                  }
                  switch(uVar9) {
                  case 0:
                    fVar13 = (float)(int)*(char *)pdVar7;
                    break;
                  case 1:
                    fVar13 = (float)(uint)*(byte *)pdVar7;
                    goto LAB_00103853;
                  case 2:
                    fVar13 = (float)(int)*(short *)pdVar7;
                    break;
                  case 3:
                    fVar13 = (float)(uint)*(ushort *)pdVar7;
                    goto LAB_00103853;
                  case 4:
                  case 5:
                    fVar13 = *(float *)pdVar7;
                    break;
                  case 6:
                    fVar13 = (float)(int)*(float *)pdVar7;
                    break;
                  case 7:
                    fVar13 = (float)(int)*pdVar7;
                    break;
                  default:
                    fVar13 = 0.0;
                    goto LAB_00103853;
                  }
                  if ((int)fVar13 < 0) goto LAB_00103ab3;
LAB_00103853:
                  uVar9 = (ulong)((int)fVar13 *
                                  *(int *)(kPLYPropertySize + (ulong)pPVar10->type * 4) + uVar14);
                  if (pcVar11 < (char *)((long)pdVar7 + uVar9)) {
LAB_00103869:
                    bVar6 = refill_buffer(this);
                    if ((!bVar6) ||
                       (pdVar7 = (double *)this->m_pos,
                       this->m_bufEnd < (char *)((long)pdVar7 + uVar9))) goto LAB_00103ab3;
                  }
LAB_0010388b:
                  this->m_pos = (char *)((long)pdVar7 + uVar9);
                  this->m_end = (char *)((long)pdVar7 + uVar9);
                  pPVar10 = pPVar10 + 1;
                } while (pPVar10 != pPVar12);
                uVar14 = local_50->count;
                uVar8 = (uint)local_48;
              }
              uVar8 = uVar8 + 1;
            } while (uVar8 < uVar14);
          }
        }
        else if (uVar14 != 0) {
          local_3c = 0;
          do {
            pPVar10 = (pPVar15->properties).
                      super__Vector_base<miniply::PLYProperty,_std::allocator<miniply::PLYProperty>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            pPVar12 = *(pointer *)
                       ((long)&(pPVar15->properties).
                               super__Vector_base<miniply::PLYProperty,_std::allocator<miniply::PLYProperty>_>
                               ._M_impl + 8);
            local_38 = pPVar12;
            if (pPVar10 != pPVar12) {
              do {
                uVar9 = (ulong)pPVar10->countType;
                if (uVar9 == 8) {
                  uVar14 = *(uint *)(kPLYPropertySize + (ulong)pPVar10->type * 4);
                  pcVar11 = this->m_pos;
                  if ((pcVar11 + uVar14 <= this->m_bufEnd) ||
                     ((bVar6 = refill_buffer(this), bVar6 &&
                      (pcVar11 = this->m_pos, pcVar11 + uVar14 <= this->m_bufEnd)))) {
                    this->m_pos = pcVar11 + uVar14;
                    this->m_end = pcVar11 + uVar14;
                    goto LAB_00103a88;
                  }
                  goto LAB_00103ab3;
                }
                uVar14 = *(uint *)(kPLYPropertySize + uVar9 * 4);
                __n = (ulong)uVar14;
                pcVar11 = this->m_bufEnd;
                __src = this->m_pos;
                uVar8 = uVar14;
                if (pcVar11 < __src + __n) {
                  bVar6 = refill_buffer(this);
                  if (!bVar6) goto LAB_00103ab3;
                  pcVar11 = this->m_bufEnd;
                  __src = this->m_pos;
                  if (pcVar11 < __src + __n) goto LAB_00103ab3;
                  uVar9 = (ulong)pPVar10->countType;
                  uVar8 = *(uint *)(kPLYPropertySize + uVar9 * 4);
                }
                local_48 = pcVar11;
                memcpy(&local_58,__src,__n);
                if (uVar8 == 8) {
                  local_58 = (double)((ulong)local_58 >> 0x38 |
                                      ((ulong)local_58 & 0xff000000000000) >> 0x28 |
                                      ((ulong)local_58 & 0xff0000000000) >> 0x18 |
                                      ((ulong)local_58 & 0xff00000000) >> 8 |
                                      ((ulong)local_58 & 0xff000000) << 8 |
                                      ((ulong)local_58 & 0xff0000) << 0x18 |
                                      ((ulong)local_58 & 0xff00) << 0x28 | (long)local_58 << 0x38);
                }
                else if (uVar8 == 4) {
                  local_58 = (double)CONCAT44(local_58._4_4_,
                                              (uint)local_58._0_4_ >> 0x18 |
                                              ((uint)local_58._0_4_ & 0xff0000) >> 8 |
                                              ((uint)local_58._0_4_ & 0xff00) << 8 |
                                              (int)local_58._0_4_ << 0x18);
                }
                else if (uVar8 == 2) {
                  local_58 = (double)CONCAT62(local_58._2_6_,
                                              local_58._0_2_ << 8 | local_58._0_2_ >> 8);
                }
                bVar4 = local_58._0_1_;
                uVar5 = local_58._0_2_;
                switch(uVar9) {
                case 0:
                  fVar13 = (float)(int)(char)bVar4;
                  break;
                case 1:
                  fVar13 = (float)(uint)bVar4;
                  goto LAB_00103a3c;
                case 2:
                  fVar13 = (float)(int)(short)uVar5;
                  break;
                case 3:
                  fVar13 = (float)(uint)uVar5;
                  goto LAB_00103a3c;
                case 4:
                case 5:
                  fVar13 = local_58._0_4_;
                  break;
                case 6:
                  fVar13 = (float)(int)local_58._0_4_;
                  break;
                case 7:
                  fVar13 = (float)(int)local_58;
                  break;
                default:
                  fVar13 = 0.0;
                  goto LAB_00103a3c;
                }
                if ((int)fVar13 < 0) goto LAB_00103ab3;
LAB_00103a3c:
                uVar14 = (int)fVar13 * *(int *)(kPLYPropertySize + (ulong)pPVar10->type * 4) +
                         uVar14;
                if ((local_48 < __src + uVar14) &&
                   ((bVar6 = refill_buffer(this), !bVar6 ||
                    (__src = this->m_pos, this->m_bufEnd < __src + uVar14)))) goto LAB_00103ab3;
                this->m_pos = __src + uVar14;
                this->m_end = __src + uVar14;
                pPVar12 = local_38;
                pPVar15 = local_50;
LAB_00103a88:
                pPVar10 = pPVar10 + 1;
              } while (pPVar10 != pPVar12);
              uVar14 = pPVar15->count;
            }
            local_3c = local_3c + 1;
          } while (local_3c < uVar14);
        }
      }
    }
  }
  return;
}

Assistant:

bool PLYReader::has_element() const
  {
    return m_valid && m_currentElement < m_elements.size();
  }